

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCastToBoolean(xmlXPathObjectPtr val)

{
  int local_1c;
  int ret;
  xmlXPathObjectPtr val_local;
  
  local_1c = 0;
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local._4_4_ = 0;
  }
  else {
    switch(val->type) {
    case XPATH_UNDEFINED:
      local_1c = 0;
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      local_1c = xmlXPathCastNodeSetToBoolean(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      local_1c = val->boolval;
      break;
    case XPATH_NUMBER:
      local_1c = xmlXPathCastNumberToBoolean(val->floatval);
      break;
    case XPATH_STRING:
      local_1c = xmlXPathCastStringToBoolean(val->stringval);
      break;
    case XPATH_USERS:
      local_1c = 0;
    }
    val_local._4_4_ = local_1c;
  }
  return val_local._4_4_;
}

Assistant:

int
xmlXPathCastToBoolean (xmlXPathObjectPtr val) {
    int ret = 0;

    if (val == NULL)
	return(0);
    switch (val->type) {
    case XPATH_UNDEFINED:
	ret = 0;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	ret = xmlXPathCastNodeSetToBoolean(val->nodesetval);
	break;
    case XPATH_STRING:
	ret = xmlXPathCastStringToBoolean(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = xmlXPathCastNumberToBoolean(val->floatval);
	break;
    case XPATH_BOOLEAN:
	ret = val->boolval;
	break;
    case XPATH_USERS:
	/* TODO */
	ret = 0;
	break;
    }
    return(ret);
}